

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.cpp
# Opt level: O2

void __thiscall bitfoot::Bitfoot::Initialize(Bitfoot *this)

{
  int64_t iVar1;
  Bitfoot *pBVar2;
  long lVar3;
  Bitfoot *pBVar4;
  long lVar5;
  Bitfoot *pBVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->ply = 0;
  this->child = (Bitfoot *)_node;
  pBVar2 = (Bitfoot *)(_hist + 0xf578);
  lVar3 = 100;
  pBVar6 = (Bitfoot *)0x0;
  lVar5 = 0;
  pBVar4 = this;
  while( true ) {
    pBVar4->parent = pBVar6;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar7) break;
    pBVar4 = (Bitfoot *)(_node + lVar5 * 0xbe8);
    pBVar6 = (Bitfoot *)0x0;
    if (lVar5 != 99) {
      pBVar6 = pBVar2 + 2;
    }
    bVar7 = lVar5 == 0;
    lVar5 = lVar5 + 1;
    pBVar2[1].ply = (int)lVar5;
    pBVar2[1].child = pBVar6;
    pBVar6 = pBVar2;
    if (bVar7) {
      pBVar6 = this;
    }
    pBVar2 = pBVar2 + 1;
  }
  _hashSize = senjo::EngineOption::GetIntValue((EngineOption *)_optHash);
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optContempt);
  _contempt = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optDelta);
  _delta = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optFutility);
  _futility = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optRZR);
  _rzr = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optTempo);
  _tempo = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optTest);
  __test = (undefined4)iVar1;
  std::__cxx11::string::string((string *)&local_40,(string *)(_optEXT + 0x30));
  _ext = std::operator==(&local_40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,(string *)(_optIID + 0x30));
  _iid = std::operator==(&local_40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,(string *)(_optLMR + 0x30));
  _lmr = std::operator==(&local_40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,(string *)(_optNMP + 0x30));
  _nmp = std::operator==(&local_40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,(string *)(_optNMR + 0x30));
  _nmr = std::operator==(&local_40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,(string *)(_optOneReply + 0x30));
  _oneReply = std::operator==(&local_40,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              _TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  memset(_hist,0,0x10000);
  SetHashSize(this,_hashSize);
  (*(this->super_ChessEngine)._vptr_ChessEngine[9])(this,senjo::ChessEngine::_STARTPOS);
  _initialized = 1;
  return;
}

Assistant:

void Bitfoot::Initialize()
{
  ply = 0;
  child = _node;
  parent = NULL;
  for (int i = 0; i < MaxPlies; ++i) {
    _node[i].ply = (i + 1);
    _node[i].child = ((i + 1) < MaxPlies) ? &(_node[i + 1]) : NULL;
    _node[i].parent = (i > 0) ? &(_node[i - 1]) : this;
  }

  _hashSize = _optHash.GetIntValue();
  _contempt = static_cast<int>(_optContempt.GetIntValue());
  _delta    = static_cast<int>(_optDelta.GetIntValue());
  _futility = static_cast<int>(_optFutility.GetIntValue());
  _rzr      = static_cast<int>(_optRZR.GetIntValue());
  _tempo    = static_cast<int>(_optTempo.GetIntValue());
  _test     = static_cast<int>(_optTest.GetIntValue());
  _ext      = (_optEXT.GetValue() == _TRUE);
  _iid      = (_optIID.GetValue() == _TRUE);
  _lmr      = (_optLMR.GetValue() == _TRUE);
  _nmp      = (_optNMP.GetValue() == _TRUE);
  _nmr      = (_optNMR.GetValue() == _TRUE);
  _oneReply = (_optOneReply.GetValue() == _TRUE);

  ClearHistory();
  SetHashSize(_hashSize);
  SetPosition(_STARTPOS);

  _initialized = true;
}